

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall doctest::Context::run(Context *this)

{
  IReporter *pIVar1;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __last;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __last_00;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __last_01;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __first;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __first_00;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __first_01;
  bool bVar2;
  uint uVar3;
  int iVar4;
  __int_type _Var5;
  char *pcVar6;
  size_type sVar7;
  size_type sVar8;
  reference ppIVar9;
  long *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<doctest::String>,_bool> pVar10;
  anon_class_1_0_00000001 DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS;
  IReporter **curr_rep_8;
  iterator __end2_3;
  iterator __begin2_3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_3;
  QueryData qdata;
  IReporter **curr_rep_7;
  iterator __end2_2;
  iterator __begin2_2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_2;
  IReporter **curr_rep_6;
  iterator __end3_1;
  iterator __begin3_1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3_1;
  IReporter **curr_rep_5;
  iterator __end5_1;
  iterator __begin5_1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range5_1;
  TestFailureException *anon_var_0;
  IReporter **curr_rep_4;
  iterator __end5;
  iterator __begin5;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range5;
  FatalConditionHandler fatalConditionHandler;
  bool run_test;
  IReporter **curr_rep_3;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  IReporter **curr_rep_2;
  iterator __end4;
  iterator __begin4;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range4;
  bool skip_me;
  TestCase *tc;
  TestCase **curr_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  *__range1_3;
  IReporter **curr_rep_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2_1;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  bool query_mode;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  value_type temp;
  int idxToSwap;
  size_t i;
  value_type *first;
  TestCase *curr_2;
  iterator __end1_2;
  iterator __begin1_2;
  set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
  *__range1_2;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  IReporter **curr_rep;
  iterator __end2;
  iterator __begin2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *curr_1;
  iterator __end1_1;
  iterator __begin1_1;
  reporterMap *__range1_1;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *curr;
  iterator __end1;
  iterator __begin1;
  reporterMap *__range1;
  anon_class_24_3_e7807fc8 cleanup_and_return;
  fstream fstr;
  ContextState *old_cs;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  undefined4 in_stack_fffffffffffff8f0;
  __int_type in_stack_fffffffffffff8f4;
  const_iterator in_stack_fffffffffffff8f8;
  TestRunStats *in_stack_fffffffffffff900;
  undefined6 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90e;
  undefined1 in_stack_fffffffffffff90f;
  int in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  _Rb_tree_const_iterator<doctest::String> in_stack_fffffffffffff918;
  undefined6 in_stack_fffffffffffff920;
  byte in_stack_fffffffffffff926;
  undefined1 in_stack_fffffffffffff927;
  ContextState *this_00;
  byte local_671;
  undefined4 in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9a4;
  undefined1 *local_5d8;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_5a8;
  undefined1 *local_5a0;
  QueryData local_598;
  reference local_580;
  IReporter **local_578;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_570;
  undefined1 *local_568;
  reference local_560;
  IReporter **local_558;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_550;
  undefined1 *local_548;
  reference local_540;
  IReporter **local_538;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_530;
  undefined1 *local_528;
  byte local_4d1;
  reference local_4d0;
  IReporter **local_4c8;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_4c0;
  undefined1 *local_4b8;
  _Base_ptr local_4b0;
  undefined1 local_4a8;
  TestCase *local_488;
  TestCase *local_468;
  reference local_460;
  IReporter **local_458;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_450;
  undefined1 *local_448;
  byte local_439;
  TestCase *local_438;
  reference local_430;
  TestCase **local_428;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_420;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  *local_418;
  reference local_410;
  IReporter **local_408;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_400;
  undefined1 *local_3f8;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> local_3f0;
  byte local_3d1;
  value_type local_3a0;
  int local_394;
  size_type local_390;
  reference local_388;
  TestCase **local_380;
  TestCase **local_378;
  TestCase **local_370;
  TestCase **local_368;
  TestCase **local_360;
  TestCase **local_358;
  reference local_350;
  reference local_348;
  _Self local_340;
  _Self local_338;
  set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
  *local_330;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  local_328;
  undefined4 local_30c;
  QueryData local_308;
  reference local_2f0;
  IReporter **local_2e8;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_2e0;
  undefined1 *local_2d8;
  IReporter **local_2d0;
  IReporter *local_2c8;
  IReporter **local_2c0;
  reference local_2b0;
  _Self local_2a8;
  _Self local_2a0;
  reporterMap *local_298;
  IReporter *local_290;
  reference local_288;
  _Self local_280;
  _Self local_278;
  reporterMap *local_270;
  char *local_250;
  ContextOptions **local_248;
  char local_228 [16];
  undefined1 auStack_218 [512];
  ContextOptions *local_18 [2];
  int local_4;
  
  local_18[0] = detail::g_cs;
  detail::g_cs = (ContextOptions *)*in_RDI;
  is_running_in_test = 1;
  *(byte *)(in_FS_OFFSET + -0x60) = *(byte *)(*in_RDI + 0x7c) & 1;
  detail::ContextState::resetRunData((ContextState *)*in_RDI);
  *(undefined8 **)*in_RDI = &std::cout;
  *(undefined8 **)(*in_RDI + 8) = &std::cerr;
  std::fstream::fstream(local_228);
  uVar3 = String::size((String *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
  if (uVar3 != 0) {
    pcVar6 = String::c_str((String *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    std::fstream::open(local_228,(_Ios_Openmode)pcVar6);
    local_5d8 = (undefined1 *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x228) {
      local_5d8 = auStack_218;
    }
    *(undefined1 **)*in_RDI = local_5d8;
  }
  anon_unknown_14::FatalConditionHandler::allocateAltStackMem();
  local_250 = local_228;
  local_248 = local_18;
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 200),8);
  bVar2 = std::vector<doctest::String,_std::allocator<doctest::String>_>::empty
                    ((vector<doctest::String,_std::allocator<doctest::String>_> *)
                     in_stack_fffffffffffff900);
  if (bVar2) {
    std::
    vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
    ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                  *)(*in_RDI + 200),8);
    String::String((String *)in_stack_fffffffffffff900,(char *)in_stack_fffffffffffff8f8._M_current)
    ;
    std::vector<doctest::String,_std::allocator<doctest::String>_>::push_back
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)
               CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (value_type *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    String::~String((String *)in_stack_fffffffffffff900);
  }
  local_270 = anon_unknown_14::getReporters();
  local_278._M_node =
       (_Base_ptr)
       std::
       map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
       ::begin((map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
                *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
  local_280._M_node =
       (_Base_ptr)
       std::
       map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
       ::end((map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
              *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
  while (bVar2 = std::operator!=(&local_278,&local_280), bVar2) {
    local_288 = std::
                _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                             *)0x118f42);
    String::c_str((String *)0x118f5b);
    std::
    vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
    ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                  *)(*in_RDI + 200),8);
    bVar2 = anon_unknown_14::matchesAny
                      ((char *)in_stack_fffffffffffff918._M_node,
                       (vector<doctest::String,_std::allocator<doctest::String>_> *)
                       CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                       (bool)in_stack_fffffffffffff90f,(bool)in_stack_fffffffffffff90e);
    if (bVar2) {
      local_290 = (*local_288->second)(detail::g_cs);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::push_back
                ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (value_type *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                  *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  }
  local_298 = anon_unknown_14::getListeners();
  local_2a0._M_node =
       (_Base_ptr)
       std::
       map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
       ::begin((map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
                *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
  local_2a8._M_node =
       (_Base_ptr)
       std::
       map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
       ::end((map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
              *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
  while (bVar2 = std::operator!=(&local_2a0,&local_2a8), bVar2) {
    local_2b0 = std::
                _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                             *)0x1190a4);
    local_2c0 = (IReporter **)
                std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                          ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                           CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    __gnu_cxx::
    __normal_iterator<doctest::IReporter*const*,std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>>
    ::__normal_iterator<doctest::IReporter**>
              ((__normal_iterator<doctest::IReporter_*const_*,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    local_2c8 = (*local_2b0->second)(detail::g_cs);
    local_2d0 = (IReporter **)
                std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::insert
                          ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                           CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                           in_stack_fffffffffffff8f8,
                           (value_type *)
                           CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                  *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  }
  if (((((*(byte *)(*in_RDI + 0x7a) & 1) == 0) && ((*(byte *)(*in_RDI + 0x87) & 1) == 0)) &&
      ((*(byte *)(*in_RDI + 0x86) & 1) == 0)) && ((*(byte *)(*in_RDI + 0x8b) & 1) == 0)) {
    std::
    vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>::
    vector((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
            *)0x1192d4);
    local_330 = detail::getRegisteredTests();
    local_338._M_node =
         (_Base_ptr)
         std::
         set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
         ::begin((set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
                  *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    local_340._M_node =
         (_Base_ptr)
         std::
         set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
         ::end((set<doctest::detail::TestCase,_std::less<doctest::detail::TestCase>,_std::allocator<doctest::detail::TestCase>_>
                *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    while (bVar2 = std::operator!=(&local_338,&local_340), bVar2) {
      local_350 = std::_Rb_tree_const_iterator<doctest::detail::TestCase>::operator*
                            ((_Rb_tree_const_iterator<doctest::detail::TestCase> *)0x119333);
      local_348 = local_350;
      std::
      vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
      ::push_back((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                   *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                  (value_type *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
      std::_Rb_tree_const_iterator<doctest::detail::TestCase>::operator++
                ((_Rb_tree_const_iterator<doctest::detail::TestCase> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    }
    sVar7 = std::
            vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
            ::size(&local_328);
    *(int *)(*in_RDI + 0x8c) = (int)sVar7;
    bVar2 = std::
            vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
            ::empty((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                     *)in_stack_fffffffffffff900);
    if (!bVar2) {
      iVar4 = String::compare((String *)in_stack_fffffffffffff8f8._M_current,
                              (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                              (bool)in_stack_fffffffffffff8ef);
      if (iVar4 == 0) {
        local_358 = (TestCase **)
                    std::
                    vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                    ::begin((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                             *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
        local_360 = (TestCase **)
                    std::
                    vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                    ::end((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                           *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
        __first._M_current._4_4_ = in_stack_fffffffffffff914;
        __first._M_current._0_4_ = in_stack_fffffffffffff910;
        __last._M_current._6_1_ = in_stack_fffffffffffff90e;
        __last._M_current._0_6_ = in_stack_fffffffffffff908;
        __last._M_current._7_1_ = in_stack_fffffffffffff90f;
        std::
        sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
                  (__first,__last,(_func_bool_TestCase_ptr_TestCase_ptr *)in_stack_fffffffffffff900)
        ;
      }
      else {
        iVar4 = String::compare((String *)in_stack_fffffffffffff8f8._M_current,
                                (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0
                                                ),(bool)in_stack_fffffffffffff8ef);
        if (iVar4 == 0) {
          local_368 = (TestCase **)
                      std::
                      vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                      ::begin((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                               *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
          local_370 = (TestCase **)
                      std::
                      vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                      ::end((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                             *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
          __first_00._M_current._4_4_ = in_stack_fffffffffffff914;
          __first_00._M_current._0_4_ = in_stack_fffffffffffff910;
          __last_00._M_current._6_1_ = in_stack_fffffffffffff90e;
          __last_00._M_current._0_6_ = in_stack_fffffffffffff908;
          __last_00._M_current._7_1_ = in_stack_fffffffffffff90f;
          std::
          sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
                    (__first_00,__last_00,
                     (_func_bool_TestCase_ptr_TestCase_ptr *)in_stack_fffffffffffff900);
        }
        else {
          in_stack_fffffffffffff9a4 =
               String::compare((String *)in_stack_fffffffffffff8f8._M_current,
                               (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0)
                               ,(bool)in_stack_fffffffffffff8ef);
          if (in_stack_fffffffffffff9a4 == 0) {
            local_378 = (TestCase **)
                        std::
                        vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                        ::begin((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                                 *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
            local_380 = (TestCase **)
                        std::
                        vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                        ::end((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                               *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
            __first_01._M_current._4_4_ = in_stack_fffffffffffff914;
            __first_01._M_current._0_4_ = in_stack_fffffffffffff910;
            __last_01._M_current._6_1_ = in_stack_fffffffffffff90e;
            __last_01._M_current._0_6_ = in_stack_fffffffffffff908;
            __last_01._M_current._7_1_ = in_stack_fffffffffffff90f;
            std::
            sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
                      (__first_01,__last_01,
                       (_func_bool_TestCase_ptr_TestCase_ptr *)in_stack_fffffffffffff900);
          }
          else {
            iVar4 = String::compare((String *)in_stack_fffffffffffff8f8._M_current,
                                    (char *)CONCAT44(in_stack_fffffffffffff8f4,
                                                     in_stack_fffffffffffff8f0),
                                    (bool)in_stack_fffffffffffff8ef);
            if (iVar4 == 0) {
              srand(*(uint *)(*in_RDI + 0x60));
              local_388 = std::
                          vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                          ::operator[](&local_328,0);
              local_390 = std::
                          vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                          ::size(&local_328);
              while (local_390 = local_390 - 1, local_390 != 0) {
                iVar4 = rand();
                local_394 = (int)((ulong)(long)iVar4 % (local_390 + 1));
                local_3a0 = local_388[local_390];
                local_388[local_390] = local_388[local_394];
                local_388[local_394] = local_3a0;
              }
            }
            else {
              String::compare((String *)in_stack_fffffffffffff8f8._M_current,
                              (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                              (bool)in_stack_fffffffffffff8ef);
            }
          }
        }
      }
    }
    std::set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>::set
              ((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_> *
               )0x1196d7);
    local_671 = 1;
    if (((*(byte *)(*in_RDI + 0x88) & 1) == 0) &&
       (local_671 = 1, (*(byte *)(*in_RDI + 0x89) & 1) == 0)) {
      local_671 = *(byte *)(*in_RDI + 0x8a);
    }
    local_3d1 = local_671 & 1;
    std::vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
    vector((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> *)
           0x119746);
    if ((local_3d1 & 1) == 0) {
      local_3f8 = (undefined1 *)((long)&detail::g_cs[1].order_by.field_0 + 8);
      local_400._M_current =
           (IReporter **)
           std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                     ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                      CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
      local_408 = (IReporter **)
                  std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                            ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                             CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8)),
            bVar2) {
        local_410 = __gnu_cxx::
                    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                    ::operator*(&local_400);
        (*(*local_410)->_vptr_IReporter[1])();
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&local_400);
      }
    }
    local_418 = &local_328;
    local_420._M_current =
         (TestCase **)
         std::
         vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
         ::begin((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                  *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    local_428 = (TestCase **)
                std::
                vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                ::end((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                       *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                              (__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8)),
          bVar2) {
      local_430 = __gnu_cxx::
                  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                  ::operator*(&local_420);
      local_438 = *local_430;
      local_439 = 0;
      if ((((local_438->super_TestCaseData).m_skip & 1U) != 0) &&
         ((*(byte *)(*in_RDI + 0x7f) & 1) == 0)) {
        local_439 = 1;
      }
      String::c_str((String *)0x1198c1);
      std::
      vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
      ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                    *)(*in_RDI + 200),0);
      bVar2 = anon_unknown_14::matchesAny
                        ((char *)in_stack_fffffffffffff918._M_node,
                         (vector<doctest::String,_std::allocator<doctest::String>_> *)
                         CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                         (bool)in_stack_fffffffffffff90f,(bool)in_stack_fffffffffffff90e);
      if (!bVar2) {
        local_439 = 1;
      }
      String::c_str((String *)0x119938);
      std::
      vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
      ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                    *)(*in_RDI + 200),1);
      bVar2 = anon_unknown_14::matchesAny
                        ((char *)in_stack_fffffffffffff918._M_node,
                         (vector<doctest::String,_std::allocator<doctest::String>_> *)
                         CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                         (bool)in_stack_fffffffffffff90f,(bool)in_stack_fffffffffffff90e);
      if (bVar2) {
        local_439 = 1;
      }
      std::
      vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
      ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                    *)(*in_RDI + 200),2);
      bVar2 = anon_unknown_14::matchesAny
                        ((char *)in_stack_fffffffffffff918._M_node,
                         (vector<doctest::String,_std::allocator<doctest::String>_> *)
                         CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                         (bool)in_stack_fffffffffffff90f,(bool)in_stack_fffffffffffff90e);
      if (!bVar2) {
        local_439 = 1;
      }
      std::
      vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
      ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                    *)(*in_RDI + 200),3);
      bVar2 = anon_unknown_14::matchesAny
                        ((char *)in_stack_fffffffffffff918._M_node,
                         (vector<doctest::String,_std::allocator<doctest::String>_> *)
                         CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                         (bool)in_stack_fffffffffffff90f,(bool)in_stack_fffffffffffff90e);
      if (bVar2) {
        local_439 = 1;
      }
      std::
      vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
      ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                    *)(*in_RDI + 200),4);
      bVar2 = anon_unknown_14::matchesAny
                        ((char *)in_stack_fffffffffffff918._M_node,
                         (vector<doctest::String,_std::allocator<doctest::String>_> *)
                         CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                         (bool)in_stack_fffffffffffff90f,(bool)in_stack_fffffffffffff90e);
      if (!bVar2) {
        local_439 = 1;
      }
      this_00 = (ContextState *)(local_438->super_TestCaseData).m_name;
      std::
      vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
      ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                    *)(*in_RDI + 200),5);
      bVar2 = anon_unknown_14::matchesAny
                        ((char *)in_stack_fffffffffffff918._M_node,
                         (vector<doctest::String,_std::allocator<doctest::String>_> *)
                         CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                         (bool)in_stack_fffffffffffff90f,(bool)in_stack_fffffffffffff90e);
      if (bVar2) {
        local_439 = 1;
      }
      if ((local_439 & 1) == 0) {
        *(int *)(*in_RDI + 0x90) = *(int *)(*in_RDI + 0x90) + 1;
      }
      if (((*(uint *)(*in_RDI + 0x68) < *(uint *)(*in_RDI + 0x90)) &&
          (*(uint *)(*in_RDI + 100) <= *(uint *)(*in_RDI + 0x68))) ||
         (*(uint *)(*in_RDI + 0x90) < *(uint *)(*in_RDI + 100))) {
        local_439 = 1;
      }
      if ((local_439 & 1) == 0) {
        if ((*(byte *)(*in_RDI + 0x88) & 1) == 0) {
          if ((*(byte *)(*in_RDI + 0x89) & 1) == 0) {
            if ((*(byte *)(*in_RDI + 0x8a) & 1) == 0) {
              *(TestCase **)(*in_RDI + 0x28) = local_438;
              *(undefined4 *)(*in_RDI + 0xb8) = 0;
              *(undefined8 *)(*in_RDI + 0xb0) = 0;
              std::__atomic_base<int>::operator=
                        ((__atomic_base<int> *)in_stack_fffffffffffff8f8._M_current,
                         in_stack_fffffffffffff8f4);
              std::__atomic_base<int>::operator=
                        ((__atomic_base<int> *)in_stack_fffffffffffff8f8._M_current,
                         in_stack_fffffffffffff8f4);
              std::
              set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
              ::clear((set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
                       *)0x119ed4);
              local_4b8 = (undefined1 *)((long)&detail::g_cs[1].order_by.field_0 + 8);
              local_4c0._M_current =
                   (IReporter **)
                   std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                             ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *
                              )CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
              local_4c8 = (IReporter **)
                          std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::
                          end((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *
                              )CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff8f4,
                                                    in_stack_fffffffffffff8f0),
                                        (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                         *)CONCAT17(in_stack_fffffffffffff8ef,
                                                    in_stack_fffffffffffff8e8)), bVar2) {
                local_4d0 = __gnu_cxx::
                            __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                            ::operator*(&local_4c0);
                (*(*local_4d0)->_vptr_IReporter[3])(*local_4d0,local_438);
                __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator++(&local_4c0);
              }
              detail::Timer::start
                        ((Timer *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
              local_4d1 = 1;
              do {
                *(undefined1 *)(*in_RDI + 0x16c) = 0;
                *(undefined4 *)(*in_RDI + 0x168) = 0;
                std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
                clear((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                       *)0x119fc1);
                std::atomic<bool>::operator=
                          ((atomic<bool> *)
                           CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                           (bool)in_stack_fffffffffffff8ef);
                std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
                          ((vector<doctest::String,_std::allocator<doctest::String>_> *)0x119ff4);
                anon_unknown_14::FatalConditionHandler::FatalConditionHandler
                          ((FatalConditionHandler *)
                           CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
                (*local_438->m_test)();
                anon_unknown_14::FatalConditionHandler::reset();
                anon_unknown_14::FatalConditionHandler::~FatalConditionHandler
                          ((FatalConditionHandler *)0x11a027);
                if (0 < *(int *)(*in_RDI + 0x6c)) {
                  in_stack_fffffffffffff910 = *(int *)(*in_RDI + 0xa0);
                  _Var5 = std::__atomic_base::operator_cast_to_int
                                    ((__atomic_base<int> *)in_stack_fffffffffffff8f8._M_current);
                  if (*(int *)(*in_RDI + 0x6c) <= in_stack_fffffffffffff910 + _Var5) {
                    local_4d1 = 0;
                    *(uint *)(*in_RDI + 0xb8) = *(uint *)(*in_RDI + 0xb8) | 8;
                  }
                }
                if (((*(byte *)(*in_RDI + 0x16c) & 1) != 0) && ((local_4d1 & 1) != 0)) {
                  local_528 = (undefined1 *)((long)&detail::g_cs[1].order_by.field_0 + 8);
                  local_530._M_current =
                       (IReporter **)
                       std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::
                       begin((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                             CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
                  local_538 = (IReporter **)
                              std::
                              vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::
                              end((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                                   *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
                  while (bVar2 = __gnu_cxx::operator!=
                                           ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                             *)CONCAT44(in_stack_fffffffffffff8f4,
                                                        in_stack_fffffffffffff8f0),
                                            (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                             *)CONCAT17(in_stack_fffffffffffff8ef,
                                                        in_stack_fffffffffffff8e8)), bVar2) {
                    local_540 = __gnu_cxx::
                                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                ::operator*(&local_530);
                    (*(*local_540)->_vptr_IReporter[4])(*local_540,local_438);
                    __gnu_cxx::
                    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                    ::operator++(&local_530);
                  }
                }
                if ((*(byte *)(*in_RDI + 0x16c) & 1) == 0) {
                  local_4d1 = 0;
                }
              } while ((local_4d1 & 1) != 0);
              detail::ContextState::finalizeTestCaseData(this_00);
              local_548 = (undefined1 *)((long)&detail::g_cs[1].order_by.field_0 + 8);
              local_550._M_current =
                   (IReporter **)
                   std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                             ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *
                              )CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
              local_558 = (IReporter **)
                          std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::
                          end((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *
                              )CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff8f4,
                                                    in_stack_fffffffffffff8f0),
                                        (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                         *)CONCAT17(in_stack_fffffffffffff8ef,
                                                    in_stack_fffffffffffff8e8)), bVar2) {
                local_560 = __gnu_cxx::
                            __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                            ::operator*(&local_550);
                (*(*local_560)->_vptr_IReporter[5])
                          (*local_560,(undefined1 *)((long)&detail::g_cs[1].binary_name.field_0 + 8)
                          );
                __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator++(&local_550);
              }
              *(undefined8 *)(*in_RDI + 0x28) = 0;
              if ((0 < *(int *)(*in_RDI + 0x6c)) &&
                 (*(int *)(*in_RDI + 0x6c) <= *(int *)(*in_RDI + 0xa0))) break;
            }
            else {
              String::String((String *)in_stack_fffffffffffff900,
                             (char *)in_stack_fffffffffffff8f8._M_current);
              sVar8 = std::
                      set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                      ::count((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                               *)in_stack_fffffffffffff900,
                              (key_type *)in_stack_fffffffffffff8f8._M_current);
              in_stack_fffffffffffff926 = false;
              if (sVar8 == 0) {
                in_stack_fffffffffffff926 = *(local_438->super_TestCaseData).m_test_suite != '\0';
              }
              in_stack_fffffffffffff927 = in_stack_fffffffffffff926;
              String::~String((String *)in_stack_fffffffffffff900);
              if ((in_stack_fffffffffffff926 & 1) != 0) {
                local_488 = local_438;
                std::
                vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                ::push_back((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                             *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                            (value_type *)
                            CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
                String::String((String *)in_stack_fffffffffffff900,
                               (char *)in_stack_fffffffffffff8f8._M_current);
                pVar10 = std::
                         set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                         ::insert((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                                   *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                                  (value_type *)
                                  CONCAT17(in_stack_fffffffffffff90f,
                                           CONCAT16(in_stack_fffffffffffff90e,
                                                    in_stack_fffffffffffff908)));
                in_stack_fffffffffffff918 = pVar10.first._M_node;
                local_4a8 = pVar10.second;
                in_stack_fffffffffffff914 = CONCAT13(local_4a8,(int3)in_stack_fffffffffffff914);
                local_4b0 = in_stack_fffffffffffff918._M_node;
                String::~String((String *)in_stack_fffffffffffff900);
                *(int *)(*in_RDI + 0x94) = *(int *)(*in_RDI + 0x94) + 1;
              }
            }
          }
          else {
            local_468 = local_438;
            std::
            vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
            push_back((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                       *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                      (value_type *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
          }
        }
      }
      else if ((local_3d1 & 1) == 0) {
        local_448 = (undefined1 *)((long)&detail::g_cs[1].order_by.field_0 + 8);
        local_450._M_current =
             (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                       ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                        CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
        local_458 = (IReporter **)
                    std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                              ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                                *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                  (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8)),
              bVar2) {
          local_460 = __gnu_cxx::
                      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                      ::operator*(&local_450);
          (*(*local_460)->_vptr_IReporter[0xb])(*local_460,local_438);
          __gnu_cxx::
          __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
          ::operator++(&local_450);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
      ::operator++(&local_420);
    }
    if ((local_3d1 & 1) == 0) {
      local_568 = (undefined1 *)((long)&detail::g_cs[1].order_by.field_0 + 8);
      local_570._M_current =
           (IReporter **)
           std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                     ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                      CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
      local_578 = (IReporter **)
                  std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                            ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                             CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8)),
            bVar2) {
        local_580 = __gnu_cxx::
                    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                    ::operator*(&local_570);
        (*(*local_580)->_vptr_IReporter[2])(*local_580,&detail::g_cs->field_0x8c);
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&local_570);
      }
    }
    else {
      QueryData::QueryData(&local_598);
      in_stack_fffffffffffff900 = (TestRunStats *)0x0;
      if (detail::g_cs != (ContextOptions *)0x0) {
        in_stack_fffffffffffff900 = (TestRunStats *)&detail::g_cs->field_0x8c;
      }
      local_598.run_stats = in_stack_fffffffffffff900;
      local_598.data =
           std::
           vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
           data((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                 *)0x11a570);
      sVar7 = std::
              vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
              ::size(&local_3f0);
      local_598.num_data = (uint)sVar7;
      local_5a0 = (undefined1 *)((long)&detail::g_cs[1].order_by.field_0 + 8);
      local_5a8._M_current =
           (IReporter **)
           std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                     ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                      CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                 CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8)),
            bVar2) {
        ppIVar9 = __gnu_cxx::
                  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                  ::operator*(&local_5a8);
        (**(*ppIVar9)->_vptr_IReporter)(*ppIVar9,&local_598);
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&local_5a8);
      }
    }
    run::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff927,
                        CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)));
    local_4 = run::anon_class_24_3_e7807fc8::operator()
                        ((anon_class_24_3_e7807fc8 *)in_stack_fffffffffffff918._M_node);
    local_30c = 1;
    std::vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
    ~vector((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> *
            )in_stack_fffffffffffff900);
    std::set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>::~set
              ((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_> *
               )0x11a67d);
    std::
    vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>::
    ~vector((vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
             *)in_stack_fffffffffffff900);
  }
  else {
    local_2d8 = (undefined1 *)((long)&detail::g_cs[1].order_by.field_0 + 8);
    local_2e0._M_current =
         (IReporter **)
         std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                   ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                    CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    local_2e8 = (IReporter **)
                std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                          ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                           CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                              (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8)),
          bVar2) {
      local_2f0 = __gnu_cxx::
                  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                  ::operator*(&local_2e0);
      pIVar1 = *local_2f0;
      local_308.run_stats = (TestRunStats *)0x0;
      local_308.data = (TestCaseData **)0x0;
      local_308.num_data = 0;
      local_308._20_4_ = 0;
      QueryData::QueryData(&local_308);
      (**pIVar1->_vptr_IReporter)(pIVar1,&local_308);
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&local_2e0);
    }
    local_4 = run::anon_class_24_3_e7807fc8::operator()
                        ((anon_class_24_3_e7807fc8 *)in_stack_fffffffffffff918._M_node);
    local_30c = 1;
  }
  std::fstream::~fstream(local_228);
  return local_4;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    // stdout by default
    p->cout = &std::cout;
    p->cerr = &std::cerr;

    // or to a file if specified
    std::fstream fstr;
    if(p->out.size()) {
        fstr.open(p->out.c_str(), std::fstream::out);
        p->cout = &fstr;
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    // see these issues on the reasoning for this:
    // - https://github.com/onqtam/doctest/issues/143#issuecomment-414418903
    // - https://github.com/onqtam/doctest/issues/126
    auto DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS = []() DOCTEST_NOINLINE
        { std::cout << std::string(); };
    DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS();

    return cleanup_and_return();
}